

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall Assimp::FIUUIDValueImpl::toString_abi_cxx11_(FIUUIDValueImpl *this)

{
  void *this_00;
  undefined8 uVar1;
  ulong uVar2;
  ostream *poVar3;
  byte *pbVar4;
  string local_1d0 [32];
  int local_1b0;
  int local_1ac;
  ulong local_1a8;
  size_type i;
  size_type valueSize;
  ostringstream local_188 [8];
  ostringstream os;
  FIUUIDValueImpl *this_local;
  
  if ((this->strValueValid & 1U) == 0) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_188);
    this_00 = (void *)std::ostream::operator<<(local_188,std::hex);
    uVar1 = std::ostream::operator<<(this_00,std::uppercase);
    valueSize._3_1_ = std::setfill<char>('0');
    std::operator<<(uVar1,valueSize._3_1_);
    i = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  (&(this->super_FIUUIDValue).super_FIByteValue.value);
    for (local_1a8 = 0; local_1a8 < i; local_1a8 = local_1a8 + 1) {
      uVar2 = local_1a8 & 0xf;
      if (uVar2 == 0) {
        if (local_1a8 != 0) {
          std::operator<<((ostream *)local_188,' ');
        }
        local_1ac = (int)std::setw(2);
        poVar3 = std::operator<<((ostream *)local_188,(_Setw)local_1ac);
        pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&(this->super_FIUUIDValue).super_FIByteValue.value,local_1a8);
        std::ostream::operator<<(poVar3,(uint)*pbVar4);
      }
      else {
        if (2 < uVar2 - 1) {
          if (uVar2 == 4) {
LAB_00ab6e7b:
            std::operator<<((ostream *)local_188,'-');
          }
          else if (uVar2 != 5) {
            if (uVar2 == 6) goto LAB_00ab6e7b;
            if (uVar2 != 7) {
              if (uVar2 == 8) goto LAB_00ab6e7b;
              if (uVar2 != 9) {
                if (uVar2 == 10) goto LAB_00ab6e7b;
                if (4 < uVar2 - 0xb) goto LAB_00ab6ee5;
              }
            }
          }
        }
        local_1b0 = (int)std::setw(2);
        poVar3 = std::operator<<((ostream *)local_188,(_Setw)local_1b0);
        pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&(this->super_FIUUIDValue).super_FIByteValue.value,local_1a8);
        std::ostream::operator<<(poVar3,(uint)*pbVar4);
      }
LAB_00ab6ee5:
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->strValue,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::hex << std::uppercase << std::setfill('0');
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                switch (i & 15) {
                case 0:
                    if (i > 0) {
                        os << ' ';
                    }
                    os << std::setw(2) << static_cast<int>(value[i]);
                    break;
                case 4:
                case 6:
                case 8:
                case 10:
                    os << '-';
                    // intentionally fall through!
                case 1:
                case 2:
                case 3:
                case 5:
                case 7:
                case 9:
                case 11:
                case 12:
                case 13:
                case 14:
                case 15:
                    os << std::setw(2) << static_cast<int>(value[i]);
                    break;
                }
            }
            strValue = os.str();
        }
        return strValue;
    }